

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netban.cpp
# Opt level: O3

int __thiscall CNetBan::UnbanByRange(CNetBan *this,CNetRange *pRange)

{
  uint uVar1;
  int iVar2;
  
  uVar1 = (pRange->m_LB).type;
  if (uVar1 == (pRange->m_UB).type) {
    iVar2 = 0x10;
    if (uVar1 == 1) {
      iVar2 = 4;
    }
    iVar2 = mem_comp((pRange->m_LB).ip,(pRange->m_UB).ip,iVar2);
    if (iVar2 < 0) {
      iVar2 = Unban<CNetBan::CBanPool<CNetRange,16>>(this,&this->m_BanRangePool,pRange);
      return iVar2;
    }
  }
  (*(this->m_pConsole->super_IInterface)._vptr_IInterface[0x19])
            (this->m_pConsole,0,"net_ban","ban failed (invalid range)",0);
  return -1;
}

Assistant:

int CNetBan::UnbanByRange(const CNetRange *pRange)
{
	if(pRange->IsValid())
		return Unban(&m_BanRangePool, pRange);

	Console()->Print(IConsole::OUTPUT_LEVEL_STANDARD, "net_ban", "ban failed (invalid range)");
	return -1;
}